

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

void __thiscall avro::NodeMap::NodeMap(NodeMap *this,SingleLeaf *values)

{
  MultiAttribute<boost::shared_ptr<avro::Node>_> *this_00;
  NodePrimitive *p;
  reference __a;
  reference __b;
  NoAttribute<int> local_33;
  NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_32;
  NoAttribute<avro::Name> local_31;
  NodePtr key;
  
  concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::MultiAttribute
            ((MultiAttribute<boost::shared_ptr<avro::Node>_> *)&key,values);
  NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  ::NodeImpl(&this->super_NodeImplMap,AVRO_MAP,&local_31,
             (MultiAttribute<boost::shared_ptr<avro::Node>_> *)&key,&local_32,&local_33);
  std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
  ~vector((vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_> *)
          &key);
  (this->super_NodeImplMap).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_00190238;
  p = (NodePrimitive *)operator_new(0x18);
  (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_STRING;
  (p->super_NodeImplPrimitive).super_Node.locked_ = false;
  (p->super_NodeImplPrimitive).super_Node._vptr_Node = (_func_int **)&PTR__Node_0018fe28;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>(&key,p);
  (*(this->super_NodeImplMap).super_Node._vptr_Node[0x12])(this);
  this_00 = &(this->super_NodeImplMap).leafAttributes_;
  __a = std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ::at(&this_00->attrs_,0);
  __b = std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ::at(&this_00->attrs_,1);
  std::swap<boost::shared_ptr<avro::Node>>(__a,__b);
  boost::detail::shared_count::~shared_count(&key.pn);
  return;
}

Assistant:

explicit NodeMap(const SingleLeaf &values) :
        NodeImplMap(AVRO_MAP, NoName(), values, NoLeafNames(), NoSize())
    { 
        // need to add the key for the map too
        NodePtr key(new NodePrimitive(AVRO_STRING));
        doAddLeaf(key);

        // key goes before value
        std::swap(leafAttributes_.get(0), leafAttributes_.get(1));
    }